

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

bool cfd::core::ComparePsbtData
               (uint8_t *src,size_t src_len,uint8_t *dest,size_t dest_len,string *item_name,
               string *key,bool ignore_duplicate_error)

{
  int iVar1;
  ulong uVar2;
  CfdException *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  CfdSourceLocation local_70;
  CfdSourceLocation local_58;
  byte local_3a;
  byte local_39;
  bool is_compare;
  string *psStack_38;
  bool ignore_duplicate_error_local;
  string *key_local;
  string *item_name_local;
  size_t dest_len_local;
  uint8_t *dest_local;
  size_t src_len_local;
  uint8_t *src_local;
  
  local_39 = ignore_duplicate_error;
  local_3a = 0;
  psStack_38 = key;
  key_local = item_name;
  item_name_local = (string *)dest_len;
  dest_len_local = (size_t)dest;
  dest_local = (uint8_t *)src_len;
  src_len_local = (size_t)src;
  if ((src_len == dest_len) && (iVar1 = memcmp(src,dest,src_len), iVar1 == 0)) {
    local_3a = 1;
  }
  else if ((local_39 & 1) == 0) {
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      local_70.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_70.filename = local_70.filename + 1;
      local_70.line = 0x134;
      local_70.funcname = "ComparePsbtData";
      logger::warn<std::__cxx11::string_const&,std::__cxx11::string_const&>
                (&local_70,"psbt {} already exist. key[{}]",key_local,psStack_38);
    }
    else {
      local_58.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_58.filename = local_58.filename + 1;
      local_58.line = 0x132;
      local_58.funcname = "ComparePsbtData";
      logger::warn<std::__cxx11::string_const&>(&local_58,"psbt {} already exist.",key_local);
    }
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::operator+(&local_b0,"psbt ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key_local)
    ;
    ::std::operator+(&local_90,&local_b0," duplicated error.");
    CfdException::CfdException(this,kCfdIllegalArgumentError,&local_90);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return (bool)(local_3a & 1);
}

Assistant:

bool ComparePsbtData(
    uint8_t *src, size_t src_len, const uint8_t *dest, size_t dest_len,
    const std::string &item_name, const std::string &key,
    bool ignore_duplicate_error) {
  bool is_compare = false;
  if ((src_len == dest_len) && (memcmp(src, dest, src_len) == 0)) {
    is_compare = true;
  } else if (ignore_duplicate_error) {
    // do nothing
  } else {
    if (key.empty()) {
      warn(CFD_LOG_SOURCE, "psbt {} already exist.", item_name);
    } else {
      warn(CFD_LOG_SOURCE, "psbt {} already exist. key[{}]", item_name, key);
    }
    throw CfdException(
        kCfdIllegalArgumentError, "psbt " + item_name + " duplicated error.");
  }
  return is_compare;
}